

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

lbool __thiscall Minisat::Solver::prefetchAssumptions(Solver *this)

{
  Lit p;
  bool bVar1;
  int iVar2;
  CRef CVar3;
  undefined8 in_RAX;
  int iVar4;
  byte bVar5;
  undefined8 uStack_38;
  
  if (((this->prefetch_assumptions == true) && ((this->trail_lim).sz == 0)) &&
     (iVar4 = (this->assumptions).sz, 0 < iVar4)) {
    iVar2 = 0;
    uStack_38 = in_RAX;
    while( true ) {
      if ((iVar4 <= iVar2) || (this->last_used_assumptions <= iVar2)) goto LAB_00119495;
      p.x = (this->assumptions).data[iVar2].x;
      bVar5 = (byte)p.x & 1;
      uStack_38 = CONCAT17((this->assigns).data[p.x >> 1].value ^ bVar5,(undefined7)uStack_38);
      bVar1 = lbool::operator==((lbool *)((long)&uStack_38 + 7),(lbool)0x1);
      if (bVar1) break;
      newDecisionLevel(this);
      uStack_38._0_7_ = CONCAT16(bVar5 ^ (this->assigns).data[p.x >> 1].value,(undefined6)uStack_38)
      ;
      bVar1 = lbool::operator==((lbool *)((long)&uStack_38 + 6),(lbool)0x2);
      if (bVar1) {
        uncheckedEnqueue(this,p,(this->trail_lim).sz,0xffffffff);
      }
      iVar2 = (this->trail_lim).sz;
      iVar4 = (this->assumptions).sz;
    }
    cancelUntil(this,0,false);
LAB_00119495:
    CVar3 = propagate(this);
    if (CVar3 != 0xffffffff) {
      cancelUntil(this,0,false);
    }
  }
  return (lbool)'\x02';
}

Assistant:

lbool Solver::prefetchAssumptions()
{
    if (prefetch_assumptions && decisionLevel() == 0 && assumptions.size() > 0) {
        while (decisionLevel() < assumptions.size() && decisionLevel() < last_used_assumptions) {
            // Perform user provided assumption:
            Lit p = assumptions[decisionLevel()];

            if (value(p) == l_False) {
                // TODO: write proper conflict handling
                cancelUntil(0);
                break;
            }

            newDecisionLevel();
            if (value(p) == l_Undef) uncheckedEnqueue(p, decisionLevel(), CRef_Undef);
        }

        assert((decisionLevel() == 0 || decisionLevel() == assumptions.size()) &&
               "we propagated all assumptions by now");

        // TODO: write proper conflict handling
        CRef confl = propagate();
        if (confl != CRef_Undef) {
            cancelUntil(0);
        }
    }

    return l_Undef; // for now, we just work with the generic case
}